

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

uint32_t __thiscall
libtorrent::aux::utp_socket_impl::ack_packet
          (utp_socket_impl *this,packet_ptr *p,time_point receive_time,uint16_t seq_nr)

{
  ushort uVar1;
  bool bVar2;
  pointer ppVar3;
  unsigned_short *puVar4;
  int64_t iVar5;
  unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> local_38;
  rep local_30;
  uint local_28;
  uint16_t local_22;
  uint32_t rtt;
  uint16_t seq_nr_local;
  packet_ptr *p_local;
  utp_socket_impl *this_local;
  time_point receive_time_local;
  
  local_22 = seq_nr;
  _rtt = p;
  p_local = (packet_ptr *)this;
  this_local = (utp_socket_impl *)receive_time.__d.__r;
  ppVar3 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::operator->
                     (p);
  if (((byte)ppVar3->field_0xe >> 6 & 1) == 0) {
    ppVar3 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::operator->
                       (p);
    uVar1 = ppVar3->size;
    ppVar3 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::operator->
                       (p);
    this->m_bytes_in_flight = this->m_bytes_in_flight - ((uint)uVar1 - (uint)ppVar3->header_size);
  }
  if ((local_22 == this->m_mtu_seq) && (this->m_mtu_seq != 0)) {
    ppVar3 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::operator->
                       (p);
    puVar4 = ::std::max<unsigned_short>(&this->m_mtu_floor,&ppVar3->size);
    this->m_mtu_floor = *puVar4;
    update_mtu_limits(this);
  }
  maybe_inc_acked_seq_nr(this);
  ppVar3 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::operator->
                     (p);
  local_30 = (rep)::std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&this_local,&ppVar3->send_time);
  iVar5 = total_microseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_>)local_30);
  local_28 = (uint)iVar5;
  ppVar3 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::operator->
                     (p);
  bVar2 = ::std::chrono::operator<
                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&this_local,&ppVar3->send_time);
  if (bVar2) {
    local_28 = 100000;
  }
  sliding_average<int,_16>::add_sample(&this->m_rtt,local_28 / 1000);
  ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::unique_ptr
            (&local_38,p);
  release_packet(this,&local_38);
  ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::~unique_ptr
            (&local_38);
  return local_28;
}

Assistant:

std::uint32_t utp_socket_impl::ack_packet(packet_ptr p, time_point const receive_time
	, std::uint16_t seq_nr)
{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
//	INVARIANT_CHECK;
#endif

	TORRENT_ASSERT(p);

	// verify that the packet we're removing was in fact sent
	// with the sequence number we expect
//	TORRENT_ASSERT(reinterpret_cast<utp_header*>(p->buf)->seq_nr == seq_nr);

	if (!p->need_resend)
	{
		TORRENT_ASSERT(m_bytes_in_flight >= p->size - p->header_size);
		m_bytes_in_flight -= p->size - p->header_size;
	}

	if (seq_nr == m_mtu_seq && m_mtu_seq != 0)
	{
		TORRENT_ASSERT(p->mtu_probe);
		// our mtu probe was acked!
		m_mtu_floor = std::max(m_mtu_floor, p->size);
		update_mtu_limits();
	}

	// increment the acked sequence number counter
	maybe_inc_acked_seq_nr();

	auto rtt = static_cast<std::uint32_t>(total_microseconds(receive_time - p->send_time));
	if (receive_time < p->send_time)
	{
		// this means our clock is not monotonic. Just assume the RTT was 100 ms
		rtt = 100000;

		// the clock for this platform is not monotonic!
		TORRENT_ASSERT_FAIL();
	}

	UTP_LOGV("%8p: acked packet %d (%d bytes) (rtt:%u)\n"
		, static_cast<void*>(this), seq_nr, p->size - p->header_size, rtt / 1000);

	m_rtt.add_sample(rtt / 1000);
	release_packet(std::move(p));
	return rtt;
}